

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * atomimm(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int iVar1;
  expr *peVar2;
  ull uVar3;
  void *pvVar4;
  disctx *in_RCX;
  bitfield *in_RDX;
  long in_RDI;
  undefined4 in_R8D;
  expr *expr;
  bitfield *bf;
  int in_stack_ffffffffffffffbc;
  bitfield *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  disctx *a_00;
  matches *local_8;
  
  if (*(int *)(in_RDI + 0x48) == 0) {
    a_00 = in_RCX;
    peVar2 = makeex((etype)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    uVar3 = getbf(in_RDX,(ull *)a_00,(ull *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),in_RCX);
    peVar2->num1 = uVar3;
    if (*(int *)(in_RDI + 0x74) <= *(int *)(in_RDI + 0x70)) {
      if (*(int *)(in_RDI + 0x74) == 0) {
        *(undefined4 *)(in_RDI + 0x74) = 0x10;
      }
      else {
        *(int *)(in_RDI + 0x74) = *(int *)(in_RDI + 0x74) << 1;
      }
      pvVar4 = realloc(*(void **)(in_RDI + 0x68),(long)*(int *)(in_RDI + 0x74) << 3);
      *(void **)(in_RDI + 0x68) = pvVar4;
    }
    iVar1 = *(int *)(in_RDI + 0x70);
    *(int *)(in_RDI + 0x70) = iVar1 + 1;
    *(expr **)(*(long *)(in_RDI + 0x68) + (long)iVar1 * 8) = peVar2;
    local_8 = (matches *)0x0;
  }
  else {
    local_8 = matchimm(in_RCX,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  }
  return local_8;
}

Assistant:

struct matches *atomimm APROTO {
	const struct bitfield *bf = v;
	if (ctx->reverse)
		return matchimm(ctx, bf, spos);
	struct expr *expr = makeex(EXPR_NUM);
	expr->num1 = GETBF(bf);
	ADDARRAY(ctx->atoms, expr);
	return NULL;
}